

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::deserializeGrammars(XMLGrammarPoolImpl *this,BinInputStream *binIn)

{
  MemoryManager *memoryManager;
  uint uVar1;
  XSerializationException *pXVar2;
  uint StorerLevel;
  JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl> cleanup;
  XMLCh LoaderLevelChar [5];
  XMLCh StorerLevelChar [5];
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  XSerializeEngine serEng;
  
  memoryManager = (this->super_XMLGrammarPool).fMemMgr;
  uVar1 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[0xb])();
  if (uVar1 != 0) {
    if (4 < uVar1) {
      pXVar2 = (XSerializationException *)__cxa_allocate_exception(0x30);
      XSerializationException::XSerializationException
                (pXVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
                 ,0x11c,XSer_StringPool_NotEmpty,memoryManager);
      __cxa_throw(pXVar2,&XSerializationException::typeinfo,XMLException::~XMLException);
    }
    (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[8])();
  }
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator(&grammarEnum,this->fGrammarRegistry,false,memoryManager);
  if ((grammarEnum.fCurElem == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
     (grammarEnum.fCurHash == (grammarEnum.fToEnum)->fHashModulus)) {
    cleanup.fToCall = (MFPT)cleanUp;
    cleanup._16_8_ = 0;
    cleanup.fObject = this;
    XSerializeEngine::XSerializeEngine(&serEng,binIn,&this->super_XMLGrammarPool,0x2000);
    XSerializeEngine::operator>>(&serEng,&StorerLevel);
    serEng.fStorerLevel = StorerLevel;
    if (StorerLevel == 7) {
      XSerializeEngine::operator>>(&serEng,&this->fLocked);
      (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[3])(this->fStringPool,&serEng);
      XTemplateSerializer::loadObject(&this->fGrammarRegistry,0x1d,true,&serEng);
      XSerializeEngine::~XSerializeEngine(&serEng);
      cleanup.fObject = (XMLGrammarPoolImpl *)0x0;
      if (this->fLocked != false) {
        (*(this->super_XMLGrammarPool)._vptr_XMLGrammarPool[0x11])(this);
      }
      JanitorMemFunCall<xercesc_4_0::XMLGrammarPoolImpl>::~JanitorMemFunCall(&cleanup);
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator(&grammarEnum);
      return;
    }
    XMLString::binToText(StorerLevel,StorerLevelChar,4,10,memoryManager);
    XMLString::binToText(7,LoaderLevelChar,4,10,memoryManager);
    pXVar2 = (XSerializationException *)__cxa_allocate_exception(0x30);
    XSerializationException::XSerializationException
              (pXVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
               ,0x140,XSer_Storer_Loader_Mismatch,StorerLevelChar,LoaderLevelChar,(XMLCh *)0x0,
               (XMLCh *)0x0,memoryManager);
    __cxa_throw(pXVar2,&XSerializationException::typeinfo,XMLException::~XMLException);
  }
  pXVar2 = (XSerializationException *)__cxa_allocate_exception(0x30);
  XSerializationException::XSerializationException
            (pXVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLGrammarPoolImpl.cpp"
             ,0x123,XSer_GrammarPool_NotEmpty,memoryManager);
  __cxa_throw(pXVar2,&XSerializationException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLGrammarPoolImpl::deserializeGrammars(BinInputStream* const binIn)
{
    MemoryManager *memMgr = getMemoryManager();
    unsigned int stringCount = fStringPool->getStringCount();
    if (stringCount)
    {
        /***
         * it contains only the four predefined one, that is ok
         * but we need to reset the string before deserialize it
         *
         ***/
        if ( stringCount <= 4 )
        {
            fStringPool->flushAll();
        }
        else
        {
            ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_StringPool_NotEmpty, memMgr);
        }
    }

    RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarRegistry, false, memMgr);
    if (grammarEnum.hasMoreElements())
    {
        ThrowXMLwithMemMgr(XSerializationException, XMLExcepts::XSer_GrammarPool_NotEmpty, memMgr);
    }

    // This object will take care of cleaning up if an exception is
    // thrown during deserialization.
    JanitorMemFunCall<XMLGrammarPoolImpl>   cleanup(this, &XMLGrammarPoolImpl::cleanUp);

    try
    {
        XSerializeEngine  serEng(binIn, this);

        //version information
        unsigned int  StorerLevel;
        serEng>>StorerLevel;
        serEng.fStorerLevel = StorerLevel;

        // The storer level must match the loader level.
        //
        if (StorerLevel != (unsigned int)XERCES_GRAMMAR_SERIALIZATION_LEVEL)
        {
            XMLCh     StorerLevelChar[5];
            XMLCh     LoaderLevelChar[5];
            XMLString::binToText(StorerLevel,                          StorerLevelChar,   4, 10, memMgr);
            XMLString::binToText(XERCES_GRAMMAR_SERIALIZATION_LEVEL,   LoaderLevelChar,   4, 10, memMgr);

            ThrowXMLwithMemMgr2(XSerializationException
                    , XMLExcepts::XSer_Storer_Loader_Mismatch
                    , StorerLevelChar
                    , LoaderLevelChar
                    , memMgr);
        }

        //lock status
        serEng>>fLocked;

        //StringPool, don't use >>
        fStringPool->serialize(serEng);

        /***
         * Deserialize RefHashTableOf<Grammar>*    fGrammarRegistry;
         ***/
        XTemplateSerializer::loadObject(&fGrammarRegistry, 29, true, serEng);

    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case, because we don't want
        // to execute cleanup code on out-of-memory
        // conditions.
        cleanup.release();

        throw;
    }

    // Everything is OK, so we can release the cleanup object.
    cleanup.release();

    if (fLocked)
    {
        createXSModel();
    }
}